

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint64_t helper_neon_sqadd_u64_aarch64(CPUARMState_conflict *env,uint64_t a,uint64_t b)

{
  if (-1 < (long)(~b & a | (~b | a) & b + a)) {
    return b + a;
  }
  (env->vfp).qc[0] = 1;
  return 0x7fffffffffffffff;
}

Assistant:

uint64_t HELPER(neon_sqadd_u64)(CPUARMState *env, uint64_t a, uint64_t b)
{
    uint64_t res;
    res = a + b;
    /* We only need to look at the pattern of SIGN bits to detect an overflow */
    if (((a & res)
         | (~b & res)
         | (a & ~b)) & SIGNBIT64) {
        SET_QC();
        res = INT64_MAX;
    }
    return res;
}